

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLE.c
# Opt level: O0

void Sle_ManMarkupVariables(Sle_Man_t *p)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  int *pList;
  Vec_Int_t *p_00;
  int local_18;
  int local_14;
  int Counter;
  int iObj;
  Sle_Man_t *p_local;
  
  local_18 = Gia_ManObjNum(p->pGia);
  p->nNodeVars = local_18;
  for (local_14 = 0; local_14 < p->pGia->nObjs; local_14 = local_14 + 1) {
    pGVar2 = Gia_ManObj(p->pGia,local_14);
    iVar1 = Gia_ObjIsAnd(pGVar2);
    if (iVar1 != 0) {
      Vec_IntWriteEntry(p->vCutFirst,local_14,local_18);
      pList = Sle_ManList(p,local_14);
      iVar1 = Sle_ListCutNum(pList);
      local_18 = iVar1 + local_18;
    }
  }
  p->nCutVars = local_18 - p->nNodeVars;
  for (local_14 = 0; local_14 < p->pGia->nObjs; local_14 = local_14 + 1) {
    pGVar2 = Gia_ManObj(p->pGia,local_14);
    iVar1 = Gia_ObjIsAnd(pGVar2);
    if (iVar1 != 0) {
      Vec_IntWriteEntry(p->vEdgeFirst,local_14,local_18);
      p_00 = Vec_WecEntry(p->vCutFanins,local_14);
      iVar1 = Vec_IntSize(p_00);
      local_18 = iVar1 + local_18;
    }
  }
  p->nEdgeVars = (local_18 - p->nCutVars) - p->nNodeVars;
  for (local_14 = 0; local_14 < p->pGia->nObjs; local_14 = local_14 + 1) {
    pGVar2 = Gia_ManObj(p->pGia,local_14);
    iVar1 = Gia_ObjIsAnd(pGVar2);
    if (iVar1 != 0) {
      Vec_IntWriteEntry(p->vDelayFirst,local_14,local_18);
      local_18 = p->nLevels + local_18;
    }
  }
  p->nDelayVars = ((local_18 - p->nEdgeVars) - p->nCutVars) - p->nNodeVars;
  p->nVarsTotal = local_18;
  return;
}

Assistant:

void Sle_ManMarkupVariables( Sle_Man_t * p )
{
    int iObj, Counter = Gia_ManObjNum(p->pGia);
    // node variables
    p->nNodeVars = Counter;
    // cut variables
    Gia_ManForEachAndId( p->pGia, iObj )
    {
        Vec_IntWriteEntry( p->vCutFirst, iObj, Counter );
        Counter += Sle_ListCutNum( Sle_ManList(p, iObj) );
    }
    p->nCutVars = Counter - p->nNodeVars;
    // edge variables
    Gia_ManForEachAndId( p->pGia, iObj )
    {
        Vec_IntWriteEntry( p->vEdgeFirst, iObj, Counter );
        Counter += Vec_IntSize( Vec_WecEntry(p->vCutFanins, iObj) );
    }
    p->nEdgeVars = Counter - p->nCutVars - p->nNodeVars;
    // delay variables
    Gia_ManForEachAndId( p->pGia, iObj )
    {
        Vec_IntWriteEntry( p->vDelayFirst, iObj, Counter );
        Counter += p->nLevels;
    }
    p->nDelayVars = Counter - p->nEdgeVars - p->nCutVars - p->nNodeVars;
    p->nVarsTotal = Counter;
}